

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_mirjit.c
# Opt level: O0

int t_getc(void *data)

{
  undefined4 local_1c;
  int c;
  ReadBuffer *buffer;
  void *data_local;
  
  local_1c = (int)*(char *)(*(long *)((long)data + 8) + *data);
  if (local_1c == 0) {
    local_1c = -1;
  }
  else {
    *(long *)data = *data + 1;
  }
  return local_1c;
}

Assistant:

static int t_getc(void *data) {
  struct ReadBuffer *buffer = data;
  int c = buffer->Source_code[buffer->Current_char];

  if (c == 0)
    c = EOF;
  else
    buffer->Current_char++;
  return c;
}